

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_expectAndActualParameters_TestShell::
~TEST_MockSupport_c_expectAndActualParameters_TestShell
          (TEST_MockSupport_c_expectAndActualParameters_TestShell *this)

{
  TEST_MockSupport_c_expectAndActualParameters_TestShell *this_local;
  
  ~TEST_MockSupport_c_expectAndActualParameters_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupport_c, expectAndActualParameters)
{
    mock_c()->expectOneCall("boo")->withIntParameters("integer", 1)->withDoubleParameters("double", 1.0)->
            withStringParameters("string", "string")->withPointerParameters("pointer", (void*) 1)->
            withFunctionPointerParameters("functionPointer", dummy_function_for_mock_c_test);
    mock_c()->actualCall("boo")->withIntParameters("integer", 1)->withDoubleParameters("double", 1.0)->
            withStringParameters("string", "string")->withPointerParameters("pointer", (void*) 1)->
            withFunctionPointerParameters("functionPointer", dummy_function_for_mock_c_test);
}